

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

TRef lj_opt_dse_ahstore(jit_State *J)

{
  IRType1 *pIVar1;
  ushort uVar2;
  IRRef1 IVar3;
  IRIns *pIVar4;
  bool bVar5;
  AliasRet AVar6;
  int iVar7;
  uint uVar8;
  TRef TVar9;
  IRIns *pIVar10;
  IRIns *pIVar11;
  uint uVar12;
  IRRef1 *local_38;
  
  uVar2 = (J->fold).ins.field_0.op1;
  IVar3 = (J->fold).ins.field_0.op2;
  pIVar4 = (J->cur).ir;
  local_38 = J->chain + (J->fold).ins.field_1.o;
  uVar12 = (uint)*local_38;
  do {
    if (uVar12 <= uVar2) goto LAB_0011cc6a;
    pIVar10 = (J->cur).ir;
    pIVar11 = pIVar10 + uVar12;
    AVar6 = aa_ahref(J,(IRIns *)((ulong)((uint)uVar2 * 8) + (long)pIVar4),
                     pIVar10 + (pIVar11->field_0).op1);
    if (AVar6 == ALIAS_MUST) {
      iVar7 = 1;
      if ((pIVar11->field_0).op2 != IVar3) {
        if (J->chain[0x11] < uVar12) {
          uVar8 = (J->cur).nins - 1;
          bVar5 = uVar12 < uVar8;
          if (uVar12 < uVar8) {
            iVar7 = 5;
            if (-1 < *(char *)((long)pIVar10 + (ulong)uVar8 * 8 + 4)) {
              pIVar10 = pIVar10 + ((ulong)uVar8 - 1);
              do {
                if (*(char *)((long)pIVar10 + 0xd) == 'I') break;
                bVar5 = pIVar11 < pIVar10;
                if (pIVar10 <= pIVar11) goto LAB_0011cc35;
                pIVar1 = &(pIVar10->field_1).t;
                pIVar10 = pIVar10 + -1;
              } while (-1 < (char)pIVar1->irt);
            }
          }
          else {
LAB_0011cc35:
            *local_38 = (pIVar11->field_0).prev;
            *pIVar11 = (IRIns)0xc0000000000;
            iVar7 = 0;
          }
          if (bVar5) goto LAB_0011cc5d;
        }
        iVar7 = 5;
      }
    }
    else if ((AVar6 != ALIAS_MAY) || (iVar7 = 5, (pIVar11->field_0).op2 == IVar3)) {
      uVar12 = (uint)(pIVar11->field_0).prev;
      local_38 = &(pIVar11->field_0).prev;
      iVar7 = 0;
    }
LAB_0011cc5d:
  } while (iVar7 == 0);
  if (iVar7 != 5) {
    return 4;
  }
LAB_0011cc6a:
  TVar9 = lj_ir_emit(J);
  return TVar9;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_ahstore(jit_State *J)
{
  IRRef xref = fins->op1;  /* xREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(xref);
  IRRef1 *refp = &J->chain[fins->o];
  IRRef ref = *refp;
  while (ref > xref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_ahref(J, xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:	/* Store to MAYBE the same location. */
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:	/* Store to the same location. */
      if (store->op2 == val)  /* Same value: drop the new store. */
	return DROPFOLD;
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards (includes conflicting loads).
	** Note that lj_tab_keyindex and lj_vm_next don't need guards,
	** since they are followed by at least one guarded VLOAD.
	*/
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t) || ir->o == IR_ALEN)
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	lj_ir_nop(store);
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}